

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::draw_pretty(Mesh *this)

{
  float fVar1;
  double dVar2;
  pointer pVVar3;
  _List_node_base *p_Var4;
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar5;
  long lVar6;
  double in_XMM1_Qa;
  undefined4 uVar7;
  undefined1 local_a8 [16];
  double local_98;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> offsets;
  Vector3D local_48;
  
  check_finite_positions(this);
  offsets.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsets.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  offsets.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar5 = &(this->mesh).vertices;
  p_Var4 = (_List_node_base *)plVar5;
  while (p_Var4 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var4->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar5) {
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
              (&originalPositions,(value_type *)&p_Var4[1]._M_prev);
    fVar1 = *(float *)((long)&p_Var4[6]._M_prev + 4);
    Vertex::normal(&local_48,(Vertex *)(p_Var4 + 1));
    dVar2 = (double)fVar1;
    in_XMM1_Qa = local_48.z * dVar2;
    local_a8._8_4_ = SUB84(dVar2 * local_48.y,0);
    local_a8._0_8_ = dVar2 * local_48.x;
    local_a8._12_4_ = (int)((ulong)(dVar2 * local_48.y) >> 0x20);
    local_98 = in_XMM1_Qa;
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
              (&offsets,(value_type *)local_a8);
  }
  lVar6 = 0;
  p_Var4 = (_List_node_base *)plVar5;
  while( true ) {
    uVar7 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
    p_Var4 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var4->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)plVar5) break;
    Vector3D::operator+=
              ((Vector3D *)&p_Var4[1]._M_prev,
               (Vector3D *)
               ((long)&(offsets.
                        super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x + lVar6));
    lVar6 = lVar6 + 0x18;
  }
  glPushMatrix();
  glTranslatef((float)(this->super_SceneObject).position.x,
               CONCAT44(uVar7,(float)(this->super_SceneObject).position.y),
               (float)(this->super_SceneObject).position.z);
  glRotatef((float)(this->super_SceneObject).rotation.x,0x3f800000,0,0);
  glRotatef((float)(this->super_SceneObject).rotation.y,0,0x3f800000,0);
  uVar7 = 0;
  glRotatef((float)(this->super_SceneObject).rotation.z,0,0,0x3f800000);
  glScalef((float)(this->super_SceneObject).scale.x,
           CONCAT44(uVar7,(float)(this->super_SceneObject).scale.y),
           (float)(this->super_SceneObject).scale.z);
  if (this->bsdf == (BSDF *)0x0) {
    glBindTexture(0xde1,0);
    local_a8._8_4_ = 0x3f800000;
    local_a8._0_8_ = 0x3f8000003f800000;
    glMaterialfv(0x404,0x1201);
  }
  else {
    glBindTexture(0xde1,0);
    glMaterialfv(0x404,0x1201,&this->bsdf->rasterize_color);
  }
  glEnable(0xb50);
  glDisable(0xbe2);
  draw_faces(this,true);
  glPopMatrix();
  pVVar3 = originalPositions.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var4 = (_List_node_base *)plVar5;
  while (p_Var4 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var4->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar5) {
    p_Var4[2]._M_prev = (_List_node_base *)pVVar3->z;
    dVar2 = pVVar3->y;
    p_Var4[1]._M_prev = (_List_node_base *)pVVar3->x;
    p_Var4[2]._M_next = (_List_node_base *)dVar2;
    pVVar3 = pVVar3 + 1;
  }
  std::_Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~_Vector_base
            (&originalPositions.
              super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>);
  std::_Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~_Vector_base
            (&offsets.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>);
  return;
}

Assistant:

void Mesh::draw_pretty() {

  check_finite_positions();

  vector<Vector3D> offsets;
  vector<Vector3D> originalPositions;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    originalPositions.push_back(v->position);
    Vector3D offset = v->offset * v->normal();
    offsets.push_back(offset);
  }

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position += offsets[i++];
  }

  glPushMatrix();
  glTranslatef(position.x, position.y, position.z);
  glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
  glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
  glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
  glScalef(scale.x, scale.y, scale.z);

  if (bsdf) {
    glBindTexture(GL_TEXTURE_2D, 0);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &bsdf->rasterize_color.r);
  } else {
    glBindTexture(GL_TEXTURE_2D, 0);
    Spectrum white = Spectrum(1., 1., 1.);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &white.r);
  }

  // Enable lighting for faces
  glEnable(GL_LIGHTING);
  glDisable(GL_BLEND);
  draw_faces(true);

  glPopMatrix();

  i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position = originalPositions[i++];
  }
}